

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLNode::DeleteChild(XMLNode *this,XMLNode *node)

{
  Unlink(this,node);
  DeleteNode(node);
  return;
}

Assistant:

void XMLNode::DeleteChild(XMLNode* node)
{
    TIXMLASSERT(node);
    TIXMLASSERT(node->_document == _document);
    TIXMLASSERT(node->_parent == this);
    Unlink(node);
    TIXMLASSERT(node->_prev == 0);
    TIXMLASSERT(node->_next == 0);
    TIXMLASSERT(node->_parent == 0);
    DeleteNode(node);
}